

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O1

Expression * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::visit
          (ConvertComplexRemapTypes *this,Constant *c)

{
  Context *context;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *end;
  Allocator *pAVar1;
  DestructorFn *pDVar2;
  undefined4 uVar3;
  Expression *pEVar4;
  PoolItem *pPVar5;
  PoolItem *pPVar6;
  Constant *pCVar7;
  ulong uVar8;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *start;
  ArraySize AVar9;
  size_t sVar10;
  Value *in_R8;
  float v;
  undefined4 extraout_XMM0_Da;
  float v_00;
  undefined4 extraout_XMM0_Da_00;
  float v_01;
  undefined4 extraout_XMM0_Da_01;
  float v_02;
  undefined4 extraout_XMM0_Db;
  float v_03;
  undefined4 extraout_XMM0_Db_00;
  float v_04;
  undefined4 extraout_XMM0_Db_01;
  PoolItem *in_XMM1_Qa;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  ArrayView<soul::Value> elements_01;
  ArrayView<soul::Value> elements_02;
  Type resultType;
  ArrayWithPreallocation<soul::Value,_8UL> realValues;
  ArrayWithPreallocation<soul::Value,_8UL> imagValues;
  byte local_578 [8];
  int local_570;
  Structure *local_568;
  PoolItem *local_560;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *local_558;
  PoolItem *local_550;
  Value *local_548;
  PrimitiveType local_540;
  PrimitiveType local_53c;
  PrimitiveType local_538;
  PrimitiveType local_534;
  Value local_530;
  Expression *local_4f0;
  CommaSeparatedList *local_4e8;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *local_4e0;
  undefined1 local_4d8 [24];
  undefined1 local_4c0 [24];
  undefined1 local_4a8 [24];
  undefined1 local_490 [24];
  undefined1 local_478 [8];
  uint64_t local_470 [1];
  StructurePtr local_468;
  CommaSeparatedList local_460 [4];
  PackedData local_260;
  undefined1 local_248 [536];
  
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_478);
  uVar3 = local_478._4_4_;
  RefCountedPtr<soul::Structure>::decIfNotNull(local_468.object);
  if (1 < uVar3 - complex32) {
    return &c->super_Expression;
  }
  context = &(c->super_Expression).super_Statement.super_ASTObject.context;
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])((Type *)local_478,c);
  pEVar4 = getRemappedType(this,context,(Type *)local_478);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_468.object);
  pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x68);
  local_4e8 = (CommaSeparatedList *)&pPVar5->item;
  AST::CommaSeparatedList::CommaSeparatedList(local_4e8,context);
  pPVar5->destructor =
       PoolAllocator::allocate<soul::AST::CommaSeparatedList,_soul::AST::Context_&>::
       anon_class_1_0_00000001::__invoke;
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_578,c);
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_478,c);
  uVar3 = local_478._4_4_;
  RefCountedPtr<soul::Structure>::decIfNotNull(local_468.object);
  local_560 = pPVar5;
  local_4f0 = pEVar4;
  if (uVar3 == complex32) {
    if (local_578[0] != 2) {
      if (local_578[0] == 3) {
        local_548 = &c->value;
        local_558 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                    (pPVar5 + 2);
        pPVar5 = (PoolItem *)0x0;
        while (pPVar5 < (PoolItem *)(long)local_570) {
          pPVar6 = (PoolItem *)((long)&pPVar5->size + 1);
          soul::Value::getSlice((Value *)local_478,local_548,(size_t)pPVar5,(size_t)pPVar6);
          local_550 = pPVar6;
          soul::Value::getData((PackedData *)local_248,(Value *)local_478);
          soul::Value::PackedData::getAsComplex32((PackedData *)local_248);
          soul::Value::~Value((Value *)local_478);
          pPVar6 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x68);
          AST::CommaSeparatedList::CommaSeparatedList((CommaSeparatedList *)&pPVar6->item,context);
          pPVar6->destructor =
               PoolAllocator::allocate<soul::AST::CommaSeparatedList,_soul::AST::Context_&>::
               anon_class_1_0_00000001::__invoke;
          pAVar1 = this->allocator;
          soul::Value::Value((Value *)local_478,v);
          pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (&pAVar1->pool,context,(Value *)local_478);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     (pPVar6 + 2),(size_t)(pPVar6[2].destructor + 1));
          pDVar2 = pPVar6[2].destructor;
          *(Constant **)(pPVar6[2].size + (long)pDVar2 * 8) = pCVar7;
          pPVar6[2].destructor = pDVar2 + 1;
          soul::Value::~Value((Value *)local_478);
          pAVar1 = this->allocator;
          soul::Value::Value((Value *)local_478,v_02);
          pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (&pAVar1->pool,context,(Value *)local_478);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     (pPVar6 + 2),(size_t)(pPVar6[2].destructor + 1));
          pDVar2 = pPVar6[2].destructor;
          *(Constant **)(pPVar6[2].size + (long)pDVar2 * 8) = pCVar7;
          pPVar6[2].destructor = pDVar2 + 1;
          soul::Value::~Value((Value *)local_478);
          pPVar5 = local_560;
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                    (local_558,(size_t)(local_560[2].destructor + 1));
          pDVar2 = pPVar5[2].destructor;
          *(void ***)(pPVar5[2].size + (long)pDVar2 * 8) = &pPVar6->item;
          pPVar5[2].destructor = pDVar2 + 1;
          pPVar5 = local_550;
          if (local_578[0] != 3) {
            throwInternalCompilerError("isArray()","getArraySize",0x128);
          }
        }
        goto LAB_00230aec;
      }
      soul::Value::getData((PackedData *)local_478,&c->value);
      soul::Value::PackedData::getAsComplex32((PackedData *)local_478);
      pAVar1 = this->allocator;
      soul::Value::Value((Value *)local_478,v_01);
      pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,(Value *)local_478);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
                 (size_t)(pPVar5[2].destructor + 1));
      pDVar2 = pPVar5[2].destructor;
      *(Constant **)(pPVar5[2].size + (long)pDVar2 * 8) = pCVar7;
      pPVar5[2].destructor = pDVar2 + 1;
      soul::Value::~Value((Value *)local_478);
      pAVar1 = this->allocator;
      soul::Value::Value((Value *)local_478,v_04);
      pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,(Value *)local_478);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
                 (size_t)(pPVar5[2].destructor + 1));
LAB_002307cb:
      pDVar2 = pPVar5[2].destructor;
      *(Constant **)(pPVar5[2].size + (long)pDVar2 * 8) = pCVar7;
      pPVar5[2].destructor = pDVar2 + 1;
      soul::Value::~Value((Value *)local_478);
      goto LAB_00230aec;
    }
    local_478 = (undefined1  [8])local_460;
    local_470[0] = 0;
    local_468.object = (Structure *)0x8;
    local_248._0_8_ = local_248 + 0x18;
    local_248._8_8_ = (uint8_t *)0x0;
    local_248._16_8_ = 8;
    sVar10 = 1;
    while( true ) {
      AVar9 = (ArraySize)local_578[0];
      uVar8 = AVar9;
      if (local_578[0] != 1) {
        if (local_578[0] != 2) {
          throwInternalCompilerError("isVector()","getVectorSize",0xf7);
        }
        uVar8 = (ulong)local_570;
      }
      if (uVar8 <= sVar10 - 1) break;
      soul::Value::getSlice(&local_530,&c->value,sVar10 - 1,sVar10);
      soul::Value::getData(&local_260,&local_530);
      soul::Value::PackedData::getAsComplex32(&local_260);
      soul::Value::~Value(&local_530);
      soul::Value::Value(&local_530,v_00);
      ArrayWithPreallocation<soul::Value,_8UL>::push_back
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_478,&local_530);
      soul::Value::~Value(&local_530);
      soul::Value::Value(&local_530,v_03);
      ArrayWithPreallocation<soul::Value,_8UL>::push_back
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248,&local_530);
      soul::Value::~Value(&local_530);
      sVar10 = sVar10 + 1;
    }
    pAVar1 = this->allocator;
    local_534.type = float32;
    if (AVar9 != 1) {
      if (local_578[0] != 2) {
        throwInternalCompilerError("isVector()","getVectorSize",0xf7);
      }
      AVar9 = (ArraySize)local_570;
    }
    Type::createVector((Type *)local_490,&local_534,AVar9);
    elements.s = (Value *)((long)((long)local_478 + 0x30) + local_470[0] * 0x40 + -0x30);
    elements.e = in_R8;
    soul::Value::createArrayOrVector(&local_530,(Value *)local_490,(Type *)local_478,elements);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,&local_530);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
               (size_t)(pPVar5[2].destructor + 1));
    pDVar2 = pPVar5[2].destructor;
    *(Constant **)(pPVar5[2].size + (long)pDVar2 * 8) = pCVar7;
    pPVar5[2].destructor = pDVar2 + 1;
    soul::Value::~Value(&local_530);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_490._16_8_);
    pAVar1 = this->allocator;
    local_538.type = float32;
    AVar9 = (ArraySize)local_578[0];
    if (local_578[0] != 1) {
      if (local_578[0] != 2) {
        throwInternalCompilerError("isVector()","getVectorSize",0xf7);
      }
      AVar9 = (ArraySize)local_570;
    }
    Type::createVector((Type *)local_4a8,&local_538,AVar9);
    elements_00.s = (Value *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    elements_00.e = in_R8;
    soul::Value::createArrayOrVector
              (&local_530,(Value *)local_4a8,(Type *)local_248._0_8_,elements_00);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,&local_530);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
               (size_t)(pPVar5[2].destructor + 1));
    pDVar2 = pPVar5[2].destructor;
    *(Constant **)(pPVar5[2].size + (long)pDVar2 * 8) = pCVar7;
    pPVar5[2].destructor = pDVar2 + 1;
    soul::Value::~Value(&local_530);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_4a8._16_8_);
  }
  else {
    if (local_578[0] != 2) {
      if (local_578[0] == 3) {
        local_548 = &c->value;
        local_4e0 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                    (pPVar5 + 2);
        start = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)0x0;
        while (start < (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                       (long)local_570) {
          end = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                ((long)&start->items + 1);
          soul::Value::getSlice((Value *)local_478,local_548,(size_t)start,(size_t)end);
          soul::Value::getData((PackedData *)local_248,(Value *)local_478);
          soul::Value::PackedData::getAsComplex64((PackedData *)local_248);
          local_558 = end;
          local_550 = in_XMM1_Qa;
          soul::Value::~Value((Value *)local_478);
          pPVar6 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x68);
          AST::CommaSeparatedList::CommaSeparatedList((CommaSeparatedList *)&pPVar6->item,context);
          pPVar6->destructor =
               PoolAllocator::allocate<soul::AST::CommaSeparatedList,_soul::AST::Context_&>::
               anon_class_1_0_00000001::__invoke;
          pAVar1 = this->allocator;
          soul::Value::Value((Value *)local_478,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))
          ;
          pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (&pAVar1->pool,context,(Value *)local_478);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     (pPVar6 + 2),(size_t)(pPVar6[2].destructor + 1));
          pDVar2 = pPVar6[2].destructor;
          *(Constant **)(pPVar6[2].size + (long)pDVar2 * 8) = pCVar7;
          pPVar6[2].destructor = pDVar2 + 1;
          soul::Value::~Value((Value *)local_478);
          pAVar1 = this->allocator;
          soul::Value::Value((Value *)local_478,(double)local_550);
          pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (&pAVar1->pool,context,(Value *)local_478);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     (pPVar6 + 2),(size_t)(pPVar6[2].destructor + 1));
          pDVar2 = pPVar6[2].destructor;
          *(Constant **)(pPVar6[2].size + (long)pDVar2 * 8) = pCVar7;
          pPVar6[2].destructor = pDVar2 + 1;
          soul::Value::~Value((Value *)local_478);
          pPVar5 = local_560;
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                    (local_4e0,(size_t)(local_560[2].destructor + 1));
          pDVar2 = pPVar5[2].destructor;
          *(void ***)(pPVar5[2].size + (long)pDVar2 * 8) = &pPVar6->item;
          pPVar5[2].destructor = pDVar2 + 1;
          start = local_558;
          if (local_578[0] != 3) {
            throwInternalCompilerError("isArray()","getArraySize",0x128);
          }
        }
        goto LAB_00230aec;
      }
      soul::Value::getData((PackedData *)local_478,&c->value);
      soul::Value::PackedData::getAsComplex64((PackedData *)local_478);
      pAVar1 = this->allocator;
      soul::Value::Value((Value *)local_478,
                         (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,(Value *)local_478);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
                 (size_t)(pPVar5[2].destructor + 1));
      pDVar2 = pPVar5[2].destructor;
      *(Constant **)(pPVar5[2].size + (long)pDVar2 * 8) = pCVar7;
      pPVar5[2].destructor = pDVar2 + 1;
      soul::Value::~Value((Value *)local_478);
      pAVar1 = this->allocator;
      soul::Value::Value((Value *)local_478,(double)in_XMM1_Qa);
      pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                         (&pAVar1->pool,context,(Value *)local_478);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
                 (size_t)(pPVar5[2].destructor + 1));
      goto LAB_002307cb;
    }
    local_478 = (undefined1  [8])local_460;
    local_470[0] = 0;
    local_468.object = (Structure *)0x8;
    local_248._0_8_ = local_248 + 0x18;
    local_248._8_8_ = (uint8_t *)0x0;
    local_248._16_8_ = 8;
    sVar10 = 1;
    while( true ) {
      AVar9 = (ArraySize)local_578[0];
      uVar8 = AVar9;
      if (local_578[0] != 1) {
        if (local_578[0] != 2) {
          throwInternalCompilerError("isVector()","getVectorSize",0xf7);
        }
        uVar8 = (ulong)local_570;
      }
      if (uVar8 <= sVar10 - 1) break;
      soul::Value::getSlice(&local_530,&c->value,sVar10 - 1,sVar10);
      soul::Value::getData(&local_260,&local_530);
      soul::Value::PackedData::getAsComplex64(&local_260);
      local_560 = in_XMM1_Qa;
      soul::Value::~Value(&local_530);
      soul::Value::Value(&local_530,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      ArrayWithPreallocation<soul::Value,_8UL>::push_back
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_478,&local_530);
      soul::Value::~Value(&local_530);
      soul::Value::Value(&local_530,(double)local_560);
      ArrayWithPreallocation<soul::Value,_8UL>::push_back
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248,&local_530);
      soul::Value::~Value(&local_530);
      sVar10 = sVar10 + 1;
    }
    pAVar1 = this->allocator;
    local_53c.type = float64;
    if (AVar9 != 1) {
      if (local_578[0] != 2) {
        throwInternalCompilerError("isVector()","getVectorSize",0xf7);
      }
      AVar9 = (ArraySize)local_570;
    }
    Type::createVector((Type *)local_4c0,&local_53c,AVar9);
    elements_01.s = (Value *)((long)((long)local_478 + 0x30) + local_470[0] * 0x40 + -0x30);
    elements_01.e = in_R8;
    soul::Value::createArrayOrVector(&local_530,(Value *)local_4c0,(Type *)local_478,elements_01);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,&local_530);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
               (size_t)(pPVar5[2].destructor + 1));
    pDVar2 = pPVar5[2].destructor;
    *(Constant **)(pPVar5[2].size + (long)pDVar2 * 8) = pCVar7;
    pPVar5[2].destructor = pDVar2 + 1;
    soul::Value::~Value(&local_530);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_4c0._16_8_);
    pAVar1 = this->allocator;
    local_540.type = float64;
    AVar9 = (ArraySize)local_578[0];
    if (local_578[0] != 1) {
      if (local_578[0] != 2) {
        throwInternalCompilerError("isVector()","getVectorSize",0xf7);
      }
      AVar9 = (ArraySize)local_570;
    }
    Type::createVector((Type *)local_4d8,&local_540,AVar9);
    elements_02.s = (Value *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    elements_02.e = in_R8;
    soul::Value::createArrayOrVector
              (&local_530,(Value *)local_4d8,(Type *)local_248._0_8_,elements_02);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar1->pool,context,&local_530);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)(pPVar5 + 2),
               (size_t)(pPVar5[2].destructor + 1));
    pDVar2 = pPVar5[2].destructor;
    *(Constant **)(pPVar5[2].size + (long)pDVar2 * 8) = pCVar7;
    pPVar5[2].destructor = pDVar2 + 1;
    soul::Value::~Value(&local_530);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_4d8._16_8_);
  }
  ArrayWithPreallocation<soul::Value,_8UL>::clear
            ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248);
  ArrayWithPreallocation<soul::Value,_8UL>::clear
            ((ArrayWithPreallocation<soul::Value,_8UL> *)local_478);
LAB_00230aec:
  pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x48);
  local_478 = (undefined1  [8])local_4e8;
  AST::CallOrCast::CallOrCast
            ((CallOrCast *)&pPVar5->item,local_4f0,
             (pool_ptr<soul::AST::CommaSeparatedList> *)local_478,false);
  pPVar5->destructor =
       PoolAllocator::
       allocate<soul::AST::CallOrCast,_soul::AST::Expression_&,_soul::AST::CommaSeparatedList_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::Structure>::decIfNotNull(local_568);
  return (Expression *)&pPVar5->item;
}

Assistant:

AST::Expression& visit (AST::Constant& c) override
        {
            super::visit (c);

            if (requiresRemapping (c.getResultType()))
            {
                auto& remappedType = getRemappedType (c.context, c.getResultType());
                auto& args = allocator.allocate<AST::CommaSeparatedList> (c.context);
                auto resultType = c.getResultType();

                if (c.getResultType().isComplex32())
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex32();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }
                else
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex64();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }

                return allocator.allocate<AST::CallOrCast> (remappedType, args, false);
            }

            return c;
        }